

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O2

REF_STATUS ref_sort_same(REF_INT n,REF_INT *list0,REF_INT *list1,REF_BOOL *same)

{
  int *piVar1;
  int *piVar2;
  REF_STATUS RVar3;
  ulong in_RAX;
  REF_INT *unique;
  REF_INT *unique_00;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  char *pcVar7;
  REF_INT n0;
  REF_INT n1;
  
  *same = 0;
  if (n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort.c",0xee,
           "ref_sort_same","malloc unique0 of REF_INT negative");
    RVar3 = 1;
  }
  else {
    _n0 = in_RAX;
    unique = (REF_INT *)malloc((ulong)(uint)n << 2);
    if (unique == (REF_INT *)0x0) {
      pcVar7 = "malloc unique0 of REF_INT NULL";
      uVar6 = 0xee;
    }
    else {
      unique_00 = (REF_INT *)malloc((ulong)(uint)n << 2);
      if (unique_00 != (REF_INT *)0x0) {
        ref_sort_unique_int(n,list0,&n0,unique);
        ref_sort_unique_int(n,list1,&n1,unique_00);
        if (n0 == n1) {
          *same = 1;
          uVar5 = 0;
          uVar4 = _n0 & 0xffffffff;
          if (n0 < 1) {
            uVar4 = uVar5;
          }
          do {
            if (uVar4 == uVar5) goto LAB_001aff65;
            piVar1 = unique + uVar5;
            piVar2 = unique_00 + uVar5;
            uVar5 = uVar5 + 1;
          } while (*piVar1 == *piVar2);
          *same = 0;
        }
LAB_001aff65:
        free(unique_00);
        free(unique);
        return 0;
      }
      pcVar7 = "malloc unique1 of REF_INT NULL";
      uVar6 = 0xef;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort.c",uVar6,
           "ref_sort_same",pcVar7);
    RVar3 = 2;
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_sort_same(REF_INT n, REF_INT *list0, REF_INT *list1,
                                 REF_BOOL *same) {
  REF_INT n0, *unique0;
  REF_INT n1, *unique1;
  REF_INT i;
  *same = REF_FALSE;
  ref_malloc(unique0, n, REF_INT);
  ref_malloc(unique1, n, REF_INT);
  RSS(ref_sort_unique_int(n, list0, &n0, unique0), "uniq0");
  RSS(ref_sort_unique_int(n, list1, &n1, unique1), "uniq1");
  if (n0 == n1) {
    *same = REF_TRUE;
    for (i = 0; i < n0; i++) {
      if (unique0[i] != unique1[i]) {
        *same = REF_FALSE;
        break;
      }
    }
  }
  ref_free(unique1);
  ref_free(unique0);
  return REF_SUCCESS;
}